

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::HeapprofdConfig::ParseFromArray(HeapprofdConfig *this,void *raw,size_t size)

{
  byte bVar1;
  pointer puVar2;
  uint uVar3;
  undefined1 uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint *extraout_RDX;
  uint *puVar9;
  uint *puVar10;
  bool bVar11;
  uint *puVar12;
  ulong uVar13;
  uint *puVar14;
  uint uVar15;
  uint *puVar16;
  uint *puVar17;
  uint *puVar18;
  bool bVar19;
  Field local_a0;
  uint *local_90;
  uint *local_88;
  uint *local_80;
  HeapprofdConfig *local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_38 = &this->process_cmdline_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_38,(this->process_cmdline_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  puVar2 = (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  local_40 = &this->target_installed_by_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_40,(this->target_installed_by_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_48 = &this->heaps_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_48,(this->heaps_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_50 = &this->exclude_heaps_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_50,(this->exclude_heaps_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  puVar2 = (this->heap_sampling_intervals_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->heap_sampling_intervals_).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->heap_sampling_intervals_).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  local_68 = &this->pid_;
  local_70 = &this->heap_sampling_intervals_;
  local_58 = &this->skip_symbol_prefix_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_58,(this->skip_symbol_prefix_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_60 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar10 = (uint *)(size + (long)raw);
  puVar9 = extraout_RDX;
  do {
    lVar8 = 7;
    if (puVar10 <= raw) goto LAB_0023de3e;
    uVar13 = (ulong)(char)(byte)*raw;
    puVar18 = (uint *)((long)raw + 1);
    if ((long)uVar13 < 0) {
      bVar1 = (byte)*raw;
      uVar6 = (ulong)(bVar1 & 0x7f);
      bVar11 = false;
      puVar14 = puVar18;
      for (lVar7 = lVar8;
          (puVar16 = puVar14, uVar13 = uVar6, (char)bVar1 < '\0' &&
          (bVar19 = 0x38 < lVar7 - 7U, bVar11 = bVar19 || puVar10 <= puVar14, puVar9 = puVar14,
          puVar16 = puVar18, uVar13 = 0, !bVar19 && puVar10 > puVar14)); lVar7 = lVar7 + 7) {
        bVar1 = (byte)*puVar14;
        puVar14 = (uint *)((long)puVar14 + 1);
        uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f);
        puVar9 = puVar14;
      }
      puVar18 = puVar16;
      if (bVar11) {
        puVar18 = (uint *)raw;
        uVar13 = 0;
      }
      if (puVar18 == (uint *)raw) goto LAB_0023de3e;
    }
    uVar5 = (uint)(uVar13 >> 3);
    if ((uVar5 == 0) || (puVar10 <= puVar18)) {
switchD_0023dcb5_caseD_3:
      bVar11 = false;
      uVar13 = 0;
      local_a0.int_value_ = (uint64_t)(uint *)0x0;
    }
    else {
      switch((uint)uVar13 & 7) {
      case 0:
        puVar12 = (uint *)0x0;
        bVar11 = puVar18 >= puVar10;
        if (puVar18 < puVar10) {
          puVar9 = (uint *)((long)puVar18 + 1);
          puVar14 = (uint *)(ulong)((byte)*puVar18 & 0x7f);
          puVar16 = puVar14;
          uVar15 = 0;
          if ((char)(byte)*puVar18 < '\0') {
            puVar16 = (uint *)0x0;
            uVar15 = 0;
            lVar8 = 7;
            puVar17 = puVar9;
            do {
              bVar19 = 0x38 < lVar8 - 7U;
              bVar11 = bVar19 || puVar10 <= puVar17;
              if (bVar19 || puVar10 <= puVar17) goto LAB_0023de45;
              uVar3 = *puVar17;
              puVar17 = (uint *)((long)puVar17 + 1);
              puVar14 = (uint *)((ulong)puVar14 |
                                (ulong)((byte)uVar3 & 0x7f) << ((byte)lVar8 & 0x3f));
              lVar8 = lVar8 + 7;
            } while ((char)(byte)uVar3 < '\0');
            puVar16 = (uint *)((ulong)puVar14 & 0xffffffff);
            puVar9 = puVar17;
            uVar15 = (uint)((ulong)puVar14 >> 0x20);
          }
        }
        else {
          puVar16 = (uint *)0x0;
          uVar15 = 0;
        }
LAB_0023de45:
        puVar14 = (uint *)(ulong)uVar15;
        if (bVar11) {
          puVar9 = puVar18;
          puVar14 = puVar12;
          puVar16 = puVar12;
        }
        local_90 = puVar18;
        local_80 = (uint *)raw;
        if (puVar9 != puVar18) goto LAB_0023de6c;
        uVar13 = 0;
        bVar11 = false;
        local_a0.int_value_ = (uint64_t)puVar12;
        goto LAB_0023deae;
      case 1:
        puVar9 = puVar18 + 2;
        if (puVar10 < puVar9) {
LAB_0023de3e:
          uVar13 = 0;
          bVar11 = false;
          local_a0.int_value_ = (uint64_t)(uint *)0x0;
          goto LAB_0023deae;
        }
        puVar16 = *(uint **)puVar18;
        puVar14 = (uint *)((ulong)puVar16 >> 0x20);
        break;
      case 2:
        bVar11 = puVar18 >= puVar10;
        puVar14 = local_88;
        if (puVar18 < puVar10) {
          bVar1 = (byte)*puVar18;
          puVar12 = (uint *)(ulong)(bVar1 & 0x7f);
          puVar16 = (uint *)((long)puVar18 + 1U);
          for (; (puVar9 = puVar16, puVar14 = puVar12, (char)bVar1 < '\0' &&
                 (bVar19 = 0x38 < lVar8 - 7U, bVar11 = bVar19 || puVar10 <= puVar16,
                 puVar9 = (uint *)((long)puVar18 + 1U), puVar14 = local_88,
                 !bVar19 && puVar10 > puVar16)); lVar8 = lVar8 + 7) {
            bVar1 = (byte)*puVar16;
            puVar16 = (uint *)((long)puVar16 + 1);
            puVar12 = (uint *)((ulong)puVar12 | (ulong)(bVar1 & 0x7f) << ((byte)lVar8 & 0x3f));
          }
        }
        local_88 = puVar14;
        if (bVar11) {
          puVar9 = puVar18;
          local_88 = (uint *)0x0;
        }
        if ((puVar9 == puVar18) || ((uint *)((long)puVar10 - (long)puVar9) < local_88)) {
          puVar14 = (uint *)0x0;
          puVar16 = (uint *)0x0;
          bVar11 = false;
          puVar12 = (uint *)0x0;
        }
        else {
          puVar14 = (uint *)((ulong)puVar9 >> 0x20);
          puVar16 = (uint *)((ulong)puVar9 & 0xffffffff);
          puVar9 = (uint *)((long)puVar9 + (long)local_88);
          bVar11 = true;
          puVar12 = local_88;
        }
        local_90 = puVar18;
        if (!bVar11) goto LAB_0023de3e;
        goto LAB_0023de6c;
      default:
        goto switchD_0023dcb5_caseD_3;
      case 5:
        puVar9 = puVar18 + 1;
        puVar14 = (uint *)0x0;
        if (puVar10 < puVar9) goto LAB_0023de3e;
        puVar16 = (uint *)(ulong)*puVar18;
      }
      puVar12 = (uint *)0x0;
LAB_0023de6c:
      bVar11 = true;
      raw = puVar9;
      if ((uVar5 < 0x10000) && (puVar12 < (uint *)0x10000000)) {
        local_a0.int_value_ = (ulong)puVar16 & 0xffffffff | (long)puVar14 << 0x20;
        uVar13 = (ulong)puVar12 | (uVar13 >> 3) << 0x20 | (ulong)((uint)uVar13 & 7) << 0x30;
        bVar11 = false;
      }
      else {
        local_a0.int_value_ = 0;
        uVar13 = 0;
      }
    }
LAB_0023deae:
    puVar18 = &switchD_0023dcb5::switchdataD_0034da20;
    if (!bVar11) {
      local_a0.size_ = (uint32_t)uVar13;
      local_a0.type_ = (uint8_t)(uVar13 >> 0x30);
      local_a0.id_ = (uint16_t)(uVar13 >> 0x20);
      local_78 = this;
      do {
        if (local_a0.id_ == 0) {
          return puVar10 == (uint *)raw;
        }
        if ((ushort)(uVar13 >> 0x20) < 0x1c) {
          (this->_has_field_).super__Base_bitset<1UL>._M_w =
               (this->_has_field_).super__Base_bitset<1UL>._M_w |
               1L << ((byte)(uVar13 >> 0x20) & 0x3f);
        }
        uVar5 = ((uint)(uVar13 >> 0x20) & 0xffff) - 1;
        if (uVar5 < 0x1b) {
          uVar4 = (*(code *)(&DAT_0034da38 + *(int *)(&DAT_0034da38 + (ulong)uVar5 * 4)))();
          return (bool)uVar4;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_a0,local_60);
        do {
          if (puVar10 <= raw) goto LAB_0023e49a;
          uVar13 = (ulong)(char)(byte)*raw;
          puVar9 = (uint *)((long)raw + 1);
          if ((long)uVar13 < 0) {
            uVar6 = (ulong)((byte)*raw & 0x7f);
            bVar11 = false;
            uVar13 = uVar6;
            puVar14 = puVar9;
            if ((char)(byte)*raw < '\0') {
              lVar8 = 7;
              puVar16 = puVar9;
              do {
                bVar11 = 0x38 < lVar8 - 7U || puVar10 <= puVar16;
                uVar13 = 0;
                puVar14 = puVar9;
                if (bVar11) break;
                uVar5 = *puVar16;
                puVar14 = (uint *)((long)puVar16 + 1);
                uVar6 = uVar6 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar8 & 0x3f);
                lVar8 = lVar8 + 7;
                uVar13 = uVar6;
                puVar16 = puVar14;
              } while ((char)(byte)uVar5 < '\0');
            }
            puVar9 = puVar14;
            if (bVar11) {
              puVar9 = (uint *)raw;
              uVar13 = 0;
            }
            if (puVar9 == (uint *)raw) goto LAB_0023e49a;
          }
          uVar5 = (uint)(uVar13 >> 3);
          if ((uVar5 == 0) || (puVar10 <= puVar9)) {
switchD_0023e2e5_caseD_3:
            bVar11 = false;
            uVar13 = 0;
            local_a0.int_value_ = (uint64_t)(uint *)0x0;
          }
          else {
            switch((uint)uVar13 & 7) {
            case 0:
              puVar12 = (uint *)0x0;
              bVar11 = puVar9 >= puVar10;
              if (puVar9 < puVar10) {
                puVar14 = (uint *)((long)puVar9 + 1);
                uVar15 = (byte)*puVar9 & 0x7f;
                uVar6 = (ulong)uVar15;
                puVar16 = (uint *)(ulong)uVar15;
                puVar18 = puVar14;
                uVar15 = 0;
                if ((char)(byte)*puVar9 < '\0') {
                  puVar16 = (uint *)0x0;
                  lVar8 = 7;
                  puVar17 = puVar14;
                  do {
                    bVar19 = 0x38 < lVar8 - 7U;
                    bVar11 = bVar19 || puVar10 <= puVar17;
                    puVar18 = puVar14;
                    uVar15 = 0;
                    if (bVar19 || puVar10 <= puVar17) break;
                    bVar1 = (byte)*puVar17;
                    puVar17 = (uint *)((long)puVar17 + 1);
                    uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)lVar8 & 0x3f);
                    lVar8 = lVar8 + 7;
                    if (-1 < (char)bVar1) {
                      puVar16 = (uint *)(uVar6 & 0xffffffff);
                    }
                    puVar18 = puVar17;
                    uVar15 = (uint)(uVar6 >> 0x20);
                  } while (-1 >= (char)bVar1);
                }
              }
              else {
                puVar16 = (uint *)0x0;
                uVar15 = 0;
              }
              if (bVar11) {
                puVar16 = puVar12;
              }
              puVar14 = (uint *)(ulong)uVar15;
              if (bVar11) {
                puVar18 = puVar9;
                puVar14 = puVar12;
              }
              this = local_78;
              local_88 = puVar9;
              local_80 = (uint *)raw;
              if (puVar18 != puVar9) goto LAB_0023e4c6;
              uVar13 = 0;
              bVar11 = false;
              local_a0.int_value_ = (uint64_t)puVar12;
              goto LAB_0023e511;
            case 1:
              puVar18 = puVar9 + 2;
              if (puVar10 < puVar18) {
LAB_0023e49a:
                uVar13 = 0;
                bVar11 = false;
                local_a0.int_value_ = (uint64_t)(uint *)0x0;
                goto LAB_0023e511;
              }
              puVar16 = *(uint **)puVar9;
              puVar14 = (uint *)((ulong)puVar16 >> 0x20);
              break;
            case 2:
              bVar11 = puVar9 >= puVar10;
              puVar14 = local_90;
              if (puVar9 < puVar10) {
                puVar16 = (uint *)((long)puVar9 + 1);
                puVar12 = (uint *)(ulong)((byte)*puVar9 & 0x7f);
                puVar18 = puVar16;
                puVar14 = puVar12;
                if ((char)(byte)*puVar9 < '\0') {
                  lVar8 = 7;
                  puVar17 = puVar16;
                  do {
                    bVar11 = 0x38 < lVar8 - 7U || puVar10 <= puVar17;
                    puVar18 = puVar16;
                    puVar14 = local_90;
                    if (bVar11) break;
                    uVar15 = *puVar17;
                    puVar17 = (uint *)((long)puVar17 + 1);
                    puVar12 = (uint *)((ulong)puVar12 |
                                      (ulong)((byte)uVar15 & 0x7f) << ((byte)lVar8 & 0x3f));
                    lVar8 = lVar8 + 7;
                    puVar18 = puVar17;
                    puVar14 = puVar12;
                  } while ((char)(byte)uVar15 < '\0');
                }
              }
              local_90 = puVar14;
              if (bVar11) {
                puVar18 = puVar9;
                local_90 = (uint *)0x0;
              }
              if ((puVar18 == puVar9) || ((uint *)((long)puVar10 - (long)puVar18) < local_90)) {
                puVar16 = (uint *)0x0;
                puVar14 = (uint *)0x0;
                bVar11 = false;
                puVar12 = (uint *)0x0;
              }
              else {
                puVar14 = (uint *)((ulong)puVar18 >> 0x20);
                puVar16 = (uint *)((ulong)puVar18 & 0xffffffff);
                puVar18 = (uint *)((long)puVar18 + (long)local_90);
                bVar11 = true;
                puVar12 = local_90;
              }
              local_88 = puVar9;
              if (!bVar11) goto LAB_0023e49a;
              goto LAB_0023e4c6;
            default:
              goto switchD_0023e2e5_caseD_3;
            case 5:
              puVar18 = puVar9 + 1;
              puVar14 = (uint *)0x0;
              if (puVar10 < puVar18) goto LAB_0023e49a;
              puVar16 = (uint *)(ulong)*puVar9;
            }
            puVar12 = (uint *)0x0;
LAB_0023e4c6:
            bVar11 = true;
            raw = puVar18;
            if ((uVar5 < 0x10000) && (puVar12 < (uint *)0x10000000)) {
              local_a0.int_value_ = (ulong)puVar16 & 0xffffffff | (long)puVar14 << 0x20;
              uVar13 = (ulong)puVar12 | (uVar13 >> 3) << 0x20 | (uVar13 & 7) << 0x30;
              bVar11 = false;
            }
            else {
              local_a0.int_value_ = 0;
              uVar13 = 0;
            }
          }
LAB_0023e511:
        } while (bVar11);
        local_a0.size_ = (uint32_t)uVar13;
        local_a0.type_ = (uint8_t)(uVar13 >> 0x30);
        local_a0.id_ = (uint16_t)(uVar13 >> 0x20);
      } while( true );
    }
  } while( true );
}

Assistant:

bool HeapprofdConfig::ParseFromArray(const void* raw, size_t size) {
  process_cmdline_.clear();
  pid_.clear();
  target_installed_by_.clear();
  heaps_.clear();
  exclude_heaps_.clear();
  heap_sampling_intervals_.clear();
  skip_symbol_prefix_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* sampling_interval_bytes */:
        field.get(&sampling_interval_bytes_);
        break;
      case 24 /* adaptive_sampling_shmem_threshold */:
        field.get(&adaptive_sampling_shmem_threshold_);
        break;
      case 25 /* adaptive_sampling_max_sampling_interval_bytes */:
        field.get(&adaptive_sampling_max_sampling_interval_bytes_);
        break;
      case 2 /* process_cmdline */:
        process_cmdline_.emplace_back();
        field.get(&process_cmdline_.back());
        break;
      case 4 /* pid */:
        pid_.emplace_back();
        field.get(&pid_.back());
        break;
      case 26 /* target_installed_by */:
        target_installed_by_.emplace_back();
        field.get(&target_installed_by_.back());
        break;
      case 20 /* heaps */:
        heaps_.emplace_back();
        field.get(&heaps_.back());
        break;
      case 27 /* exclude_heaps */:
        exclude_heaps_.emplace_back();
        field.get(&exclude_heaps_.back());
        break;
      case 23 /* stream_allocations */:
        field.get(&stream_allocations_);
        break;
      case 22 /* heap_sampling_intervals */:
        heap_sampling_intervals_.emplace_back();
        field.get(&heap_sampling_intervals_.back());
        break;
      case 21 /* all_heaps */:
        field.get(&all_heaps_);
        break;
      case 5 /* all */:
        field.get(&all_);
        break;
      case 15 /* min_anonymous_memory_kb */:
        field.get(&min_anonymous_memory_kb_);
        break;
      case 16 /* max_heapprofd_memory_kb */:
        field.get(&max_heapprofd_memory_kb_);
        break;
      case 17 /* max_heapprofd_cpu_secs */:
        field.get(&max_heapprofd_cpu_secs_);
        break;
      case 7 /* skip_symbol_prefix */:
        skip_symbol_prefix_.emplace_back();
        field.get(&skip_symbol_prefix_.back());
        break;
      case 6 /* continuous_dump_config */:
        (*continuous_dump_config_).ParseFromArray(field.data(), field.size());
        break;
      case 8 /* shmem_size_bytes */:
        field.get(&shmem_size_bytes_);
        break;
      case 9 /* block_client */:
        field.get(&block_client_);
        break;
      case 14 /* block_client_timeout_us */:
        field.get(&block_client_timeout_us_);
        break;
      case 10 /* no_startup */:
        field.get(&no_startup_);
        break;
      case 11 /* no_running */:
        field.get(&no_running_);
        break;
      case 13 /* dump_at_max */:
        field.get(&dump_at_max_);
        break;
      case 18 /* disable_fork_teardown */:
        field.get(&disable_fork_teardown_);
        break;
      case 19 /* disable_vfork_detection */:
        field.get(&disable_vfork_detection_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}